

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdImageColorClosestHWB(gdImagePtr im,int r,int g,int b)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  RGBType RGB;
  RGBType RGB_00;
  HWBType HWB2;
  HWBType HWB1;
  HWBType local_60;
  HWBType local_54;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (im->trueColor == 0) {
    iVar1 = im->colorsTotal;
    if ((long)iVar1 < 1) {
      iVar3 = -1;
    }
    else {
      auVar6._0_8_ = (double)r;
      auVar6._8_8_ = (double)g;
      auVar6 = divpd(auVar6,_DAT_00124010);
      local_48 = CONCAT44((float)auVar6._8_8_,(float)auVar6._0_8_);
      uStack_40 = 0;
      iVar4 = -1;
      iVar3 = -1;
      bVar2 = 1;
      fVar8 = 0.0;
      lVar5 = 0;
      do {
        if (im->open[lVar5] == 0) {
          auVar7._0_8_ = (double)im->red[lVar5];
          auVar7._8_8_ = (double)im->green[lVar5];
          auVar6 = divpd(auVar7,_DAT_00124010);
          RGB.R = (float)auVar6._0_8_;
          RGB.G = (float)auVar6._8_8_;
          RGB.B = (float)im->blue[lVar5] / 255.0;
          RGB_to_HWB(RGB,&local_54);
          RGB_00.B = (float)b / 255.0;
          RGB_00.R = (float)(undefined4)local_48;
          RGB_00.G = (float)local_48._4_4_;
          RGB_to_HWB(RGB_00,&local_60);
          fVar9 = 0.0;
          if ((((local_54.H != -1.0) || (NAN(local_54.H))) &&
              ((local_60.H != -1.0 || (NAN(local_60.H))))) &&
             (fVar9 = ABS(local_54.H - local_60.H), 3.0 < fVar9)) {
            fVar9 = 6.0 - fVar9;
          }
          fVar9 = (local_54.B - local_60.B) * (local_54.B - local_60.B) +
                  fVar9 * fVar9 + (local_54.W - local_60.W) * (local_54.W - local_60.W);
          iVar3 = (int)lVar5;
          if (!(bool)(fVar9 < fVar8 | bVar2)) {
            fVar9 = fVar8;
            iVar3 = iVar4;
          }
          bVar2 = 0;
          iVar4 = iVar3;
          fVar8 = fVar9;
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
  }
  else {
    iVar3 = g * 0x100 + r * 0x10000 + b;
  }
  return iVar3;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestHWB (gdImagePtr im, int r, int g, int b)
{
	int i;
	/* long rd, gd, bd; */
	int ct = (-1);
	int first = 1;
	float mindist = 0;
	if (im->trueColor) {
		return gdTrueColor (r, g, b);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		float dist;
		if (im->open[i]) {
			continue;
		}
		dist = HWB_Diff (im->red[i], im->green[i], im->blue[i], r, g, b);
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}